

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_UpdateEngine(FAudio *audio,float *output)

{
  if (audio->pClientEngineProc != (FAudioEngineProcedureEXT)0x0) {
    (*audio->pClientEngineProc)(FAudio_INTERNAL_GenerateOutput,audio,output,audio->clientEngineUser)
    ;
    return;
  }
  FAudio_INTERNAL_GenerateOutput(audio,output);
  return;
}

Assistant:

void FAudio_INTERNAL_UpdateEngine(FAudio *audio, float *output)
{
	LOG_FUNC_ENTER(audio)
	if (audio->pClientEngineProc)
	{
		audio->pClientEngineProc(
			&FAudio_INTERNAL_GenerateOutput,
			audio,
			output,
			audio->clientEngineUser
		);
	}
	else
	{
		FAudio_INTERNAL_GenerateOutput(audio, output);
	}